

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_dev.cpp
# Opt level: O3

bool ReadBlockDevice(string *path,shared_ptr<Disk> *disk)

{
  BlockFloppyDisk *this;
  bool bVar1;
  bool bVar2;
  tuple<BlockDevice_*,_std::default_delete<BlockDevice>_> this_00;
  exception *this_01;
  __single_object blockdev;
  shared_ptr<BlockFloppyDisk> blk_dev_disk;
  __uniq_ptr_impl<BlockDevice,_std::default_delete<BlockDevice>_> local_88;
  BlockFloppyDisk *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  CylHead local_70;
  Format local_68;
  
  bVar1 = IsBlockDevice(path);
  if (bVar1) {
    this_00.super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>.
    super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>)operator_new(0x2b8);
    BlockDevice::BlockDevice
              ((BlockDevice *)
               this_00.super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>.
               super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl);
    local_88._M_t.super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>.
    super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl =
         (tuple<BlockDevice_*,_std::default_delete<BlockDevice>_>)
         (tuple<BlockDevice_*,_std::default_delete<BlockDevice>_>)
         this_00.super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>.
         super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl;
    bVar1 = BlockDevice::Open((BlockDevice *)
                              this_00.
                              super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>
                              .super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl,path,true);
    if (bVar1) {
      local_68.cyls = 0x50;
      local_68.heads = 2;
      local_68.fdc = PC;
      local_68.datarate = Unknown;
      local_68.encoding = Unknown;
      local_68.sectors = 0;
      local_68.size = 2;
      local_68.base = 1;
      local_68.offset = 0;
      local_68.interleave = 1;
      local_68.skew._0_2_ = 0;
      local_68._42_6_ = 0;
      local_68.head1._0_2_ = 1;
      local_68._50_6_ = 0;
      local_68.fill = '\0';
      local_68.cyls_first = false;
      bVar2 = Format::FromSize(*(int64_t *)
                                ((long)local_88._M_t.
                                       super__Tuple_impl<0UL,_BlockDevice_*,_std::default_delete<BlockDevice>_>
                                       .super__Head_base<0UL,_BlockDevice_*,_false>._M_head_impl +
                                0x28),&local_68);
      if (!bVar2) {
        this_01 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20]>(this_01,(char (*) [20])"not a floppy device");
LAB_0017a4e6:
        __cxa_throw(this_01,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_68.sectors < opt.sectors) {
        this_01 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[25],int&>
                  (this_01,(char (*) [25])"sector count must be <= ",&local_68.sectors);
        goto LAB_0017a4e6;
      }
      if (0 < opt.sectors) {
        local_68.sectors = (int)opt.sectors;
      }
      local_80 = (BlockFloppyDisk *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<BlockFloppyDisk,std::allocator<BlockFloppyDisk>,std::unique_ptr<BlockDevice,std::default_delete<BlockDevice>>>
                (&local_78,&local_80,(allocator<BlockFloppyDisk> *)&local_70,
                 (unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_> *)&local_88);
      this = local_80;
      CylHead::CylHead(&local_70,local_68.cyls + -1,local_68.heads + -1);
      DemandDisk::extend(&this->super_DemandDisk,&local_70);
      *(ulong *)((long)&(local_80->super_DemandDisk).super_Disk.fmt.skew + 2) =
           CONCAT26((undefined2)local_68.head1,local_68._42_6_);
      *(ulong *)((long)&(local_80->super_DemandDisk).super_Disk.fmt.head1 + 2) =
           CONCAT26(local_68._56_2_,local_68._50_6_);
      (local_80->super_DemandDisk).super_Disk.fmt.offset = local_68.offset;
      (local_80->super_DemandDisk).super_Disk.fmt.interleave = local_68.interleave;
      (local_80->super_DemandDisk).super_Disk.fmt.skew =
           (int)CONCAT62(local_68._42_6_,(undefined2)local_68.skew);
      (local_80->super_DemandDisk).super_Disk.fmt.head0 = local_68.head0;
      (local_80->super_DemandDisk).super_Disk.fmt.encoding = local_68.encoding;
      (local_80->super_DemandDisk).super_Disk.fmt.sectors = local_68.sectors;
      (local_80->super_DemandDisk).super_Disk.fmt.size = local_68.size;
      (local_80->super_DemandDisk).super_Disk.fmt.base = local_68.base;
      (local_80->super_DemandDisk).super_Disk.fmt.cyls = local_68.cyls;
      (local_80->super_DemandDisk).super_Disk.fmt.heads = local_68.heads;
      (local_80->super_DemandDisk).super_Disk.fmt.fdc = local_68.fdc;
      (local_80->super_DemandDisk).super_Disk.fmt.datarate = local_68.datarate;
      std::__cxx11::string::_M_replace
                ((ulong)&(local_80->super_DemandDisk).super_Disk.strType,0,
                 (char *)(local_80->super_DemandDisk).super_Disk.strType._M_string_length,0x1b128e);
      (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)local_80
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,&local_78
                );
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
      }
    }
    std::unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_>::~unique_ptr
              ((unique_ptr<BlockDevice,_std::default_delete<BlockDevice>_> *)&local_88);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ReadBlockDevice(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (!IsBlockDevice(path))
        return false;

    auto blockdev = std::make_unique<BlockDevice>();
    if (!blockdev->Open(path, true))
        return false;

    Format fmt;
    if (!Format::FromSize(blockdev->total_bytes, fmt))
        throw util::exception("not a floppy device");

    // Allow subsets of the track format
    if (opt.sectors > fmt.sectors)
        throw util::exception("sector count must be <= ", fmt.sectors);
    else if (opt.sectors > 0)
        fmt.sectors = opt.sectors;

    auto blk_dev_disk = std::make_shared<BlockFloppyDisk>(std::move(blockdev));
    blk_dev_disk->extend(CylHead(fmt.cyls - 1, fmt.heads - 1));
    blk_dev_disk->fmt = fmt;

    blk_dev_disk->strType = "Block Floppy Device";
    disk = blk_dev_disk;

    return true;
}